

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O3

void array_run_container_inplace_union(array_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  rle16_t *prVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  rle16_t rVar6;
  rle16_t rVar7;
  uint uVar8;
  uint uVar9;
  rle16_t *prVar10;
  uint uVar11;
  uint uVar12;
  rle16_t rVar13;
  rle16_t rVar14;
  rle16_t rVar15;
  uint uVar16;
  long lVar17;
  
  iVar5 = src_2->n_runs;
  prVar10 = src_2->runs;
  if ((((long)iVar5 != 1) || (prVar10->value != 0)) || (prVar10->length != 0xffff)) {
    lVar17 = (long)src_1->cardinality + (long)iVar5;
    iVar4 = (int)lVar17 + iVar5;
    if (src_2->capacity < iVar4) {
      run_container_grow(src_2,iVar4,true);
      prVar10 = src_2->runs;
      iVar5 = src_2->n_runs;
    }
    memmove(prVar10 + lVar17,prVar10,(long)iVar5 << 2);
    prVar2 = src_2->runs;
    prVar10 = prVar2 + lVar17;
    iVar5 = src_2->n_runs;
    src_2->n_runs = 0;
    uVar1 = *src_1->array;
    bVar3 = prVar10->value <= uVar1;
    if (bVar3) {
      rVar7 = *prVar10;
      *prVar2 = rVar7;
      iVar4 = src_2->n_runs + 1;
    }
    else {
      rVar7.length = 0;
      rVar7.value = uVar1;
      prVar2->value = uVar1;
      prVar2->length = 0;
      iVar4 = 1;
    }
    uVar12 = (uint)!bVar3;
    uVar11 = (uint)bVar3;
    src_2->n_runs = iVar4;
    uVar9 = (uint)rVar7 >> 0x10;
    while (((int)uVar11 < iVar5 && ((int)uVar12 < src_1->cardinality))) {
      uVar1 = src_1->array[(int)uVar12];
      rVar14.length = 0;
      rVar14.value = uVar1;
      if (uVar1 < prVar10[(int)uVar11].value) {
        uVar8 = (uVar9 & 0xffff) + ((uint)rVar7 & 0xffff) + 1;
        if (uVar8 < uVar1) {
          rVar15.length = 0;
          rVar15.value = uVar1;
          src_2->runs[src_2->n_runs] = rVar15;
          src_2->n_runs = src_2->n_runs + 1;
          uVar9 = 0;
          rVar7 = rVar14;
        }
        else if (uVar8 == uVar1) {
          uVar9 = uVar9 + 1;
          src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | (uint)rVar7 & 0xffff);
        }
        uVar12 = uVar12 + 1;
      }
      else {
        rVar14 = prVar10[(int)uVar11];
        uVar8 = (uint)rVar7 & 0xffff;
        if (uVar8 + (uVar9 & 0xffff) + 1 < ((uint)rVar14 & 0xffff)) {
          prVar2 = src_2->runs;
          iVar4 = src_2->n_runs;
          prVar2[iVar4].value = rVar14.value;
          prVar2[iVar4].length = rVar14.length;
          src_2->n_runs = iVar4 + 1;
          rVar7 = rVar14;
          uVar9 = (uint)rVar14 >> 0x10;
        }
        else {
          uVar16 = ((uint)rVar14 & 0xffff) + ((uint)rVar14 >> 0x10);
          if ((uVar9 & 0xffff) + uVar8 <= uVar16) {
            uVar9 = uVar16 - uVar8;
            src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar8);
          }
        }
        uVar11 = uVar11 + 1;
      }
    }
    if ((int)uVar12 < src_1->cardinality) {
      lVar17 = (long)(int)uVar12;
      do {
        uVar1 = src_1->array[lVar17];
        rVar6.length = 0;
        rVar6.value = uVar1;
        uVar11 = (uVar9 & 0xffff) + ((uint)rVar7 & 0xffff) + 1;
        if (uVar11 < uVar1) {
          rVar13.length = 0;
          rVar13.value = uVar1;
          src_2->runs[src_2->n_runs] = rVar13;
          src_2->n_runs = src_2->n_runs + 1;
          uVar9 = 0;
          rVar7 = rVar6;
        }
        else if (uVar11 == uVar1) {
          uVar9 = uVar9 + 1;
          src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | (uint)rVar7 & 0xffff);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < src_1->cardinality);
    }
    else if ((int)uVar11 < iVar5) {
      lVar17 = (long)(int)uVar11;
      do {
        rVar14 = prVar10[lVar17];
        uVar11 = (uint)rVar7 & 0xffff;
        if (uVar11 + (uVar9 & 0xffff) + 1 < ((uint)rVar14 & 0xffff)) {
          prVar2 = src_2->runs;
          iVar4 = src_2->n_runs;
          prVar2[iVar4].value = rVar14.value;
          prVar2[iVar4].length = rVar14.length;
          src_2->n_runs = iVar4 + 1;
          rVar7 = rVar14;
          uVar9 = (uint)rVar14 >> 0x10;
        }
        else {
          uVar12 = ((uint)rVar14 & 0xffff) + ((uint)rVar14 >> 0x10);
          if ((uVar9 & 0xffff) + uVar11 <= uVar12) {
            uVar9 = uVar12 - uVar11;
            src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar11);
          }
        }
        lVar17 = lVar17 + 1;
      } while (iVar5 != lVar17);
    }
  }
  return;
}

Assistant:

void array_run_container_inplace_union(const array_container_t *src_1,
                                       run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return;
    }
    const int32_t maxoutput = src_1->cardinality + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_2->n_runs;
    if (src_2->capacity < neededcapacity)
        run_container_grow(src_2, neededcapacity, true);
    memmove(src_2->runs + maxoutput, src_2->runs,
            src_2->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc2 = src_2->runs + maxoutput;
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    int src2nruns = src_2->n_runs;
    src_2->n_runs = 0;

    rle16_t previousrle;

    if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(src_2, inputsrc2[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(src_2, src_1->array[arraypos]);
        arraypos++;
    }

    while ((rlepos < src2nruns) && (arraypos < src_1->cardinality)) {
        if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src2nruns) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        }
    }
}